

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip.cpp
# Opt level: O2

string * __thiscall
libtorrent::gzip_error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,gzip_error_category *this,int ev)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if ((uint)ev < 0x10) {
    __s = message::msgs.super_array<const_char_*,_16UL>._M_elems[(uint)ev];
    __a = &local_a;
  }
  else {
    __s = "Unknown error";
    __a = &local_9;
  }
  ::std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string gzip_error_category::message(int ev) const
	{
		static aux::array<char const*, 16> msgs{
		{
			"no error",
			"invalid gzip header",
			"inflated data too large",
			"available inflate data did not terminate",
			"output space exhausted before completing inflate",
			"invalid block type (type == 3)",
			"stored block length did not match one's complement",
			"dynamic block code description: too many length or distance codes",
			"dynamic block code description: code lengths codes incomplete",
			"dynamic block code description: repeat lengths with no first length",
			"dynamic block code description: repeat more than specified lengths",
			"dynamic block code description: invalid literal/length code lengths",
			"dynamic block code description: invalid distance code lengths",
			"invalid literal/length or distance code in fixed or dynamic block",
			"distance is too far back in fixed or dynamic block",
			"unknown gzip error",
		}};
		if (ev < 0 || ev >= msgs.end_index())
			return "Unknown error";
		return msgs[ev];
	}